

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void ti925t_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0xe);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),10);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x54029252;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x5109149;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0x70;
  return;
}

Assistant:

static void ti925t_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    set_feature(&cpu->env, ARM_FEATURE_V4T);
    set_feature(&cpu->env, ARM_FEATURE_OMAPCP);
    cpu->midr = ARM_CPUID_TI925T;
    cpu->ctr = 0x5109149;
    cpu->reset_sctlr = 0x00000070;
}